

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

ScatterOut * __thiscall
cert::Dielectric::scatter
          (ScatterOut *__return_storage_ptr__,Dielectric *this,Vec3 point,Vec3 normal,UV uv,
          Ray *r_in,PRNG *random)

{
  double dVar1;
  float fVar2;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar8;
  float fVar9;
  RefractDataOut RVar10;
  float local_a4;
  Vec3 local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_98.z = normal.z;
  local_98._0_8_ = normal._0_8_;
  fVar3 = point.z;
  local_38._8_4_ = in_XMM0_Dc;
  local_38._0_8_ = point._0_8_;
  local_38._12_4_ = in_XMM0_Dd;
  fVar7 = normal.y;
  local_88._0_4_ = (r_in->direction).x;
  local_88._4_4_ = 0;
  fStack_80 = 0.0;
  fStack_7c = 0.0;
  local_68._0_4_ = (r_in->direction).y;
  local_68._4_4_ = 0;
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  fVar8 = (r_in->direction).z;
  local_a4 = fVar8 * local_98.z + (float)local_88._0_4_ * normal.x + fVar7 * (float)local_68._0_4_;
  fVar2 = local_a4 + local_a4;
  auVar5._8_4_ = in_XMM2_Dc;
  auVar5._0_8_ = local_98._0_8_;
  auVar5._12_4_ = in_XMM2_Dd;
  auVar6._4_12_ = auVar5._4_12_;
  auVar6._0_4_ = normal.x * fVar2;
  fVar9 = fVar7 * fVar2;
  fVar2 = fVar2 * local_98.z;
  if (local_a4 <= 0.0) {
    local_a4 = 0.0;
    fVar7 = 1.0 / *(float *)&(this->super_Material).field_0x14;
  }
  else {
    local_48._0_4_ = fVar2;
    local_98.z = -local_98.z;
    local_98._0_8_ = local_98._0_8_ ^ 0x8000000080000000;
    local_6c = *(float *)&(this->super_Material).field_0x14;
    local_a4 = local_a4 * local_6c;
    fVar2 = (float)local_68._0_4_ * (float)local_68._0_4_;
    fVar4 = (float)local_88._0_4_ * (float)local_88._0_4_;
    _local_88 = ZEXT416((uint)local_88._0_4_);
    local_68 = ZEXT416((uint)local_68._0_4_);
    local_58._4_4_ = fVar7;
    local_58._0_4_ = fVar9;
    fStack_50 = fVar7;
    fStack_4c = fVar7;
    local_28 = auVar6;
    dVar1 = sqrt((double)(ulong)(uint)(fVar8 * fVar8 + fVar4 + fVar2));
    local_a4 = local_a4 / SUB84(dVar1,0);
    fVar2 = (float)local_48._0_4_;
    auVar6 = local_28;
    fVar9 = (float)local_58._0_4_;
    fVar7 = local_6c;
  }
  local_88._0_4_ = (float)local_88._0_4_ - auVar6._0_4_;
  local_68._0_4_ = (float)local_68._0_4_ - fVar9;
  fVar8 = fVar8 - fVar2;
  RVar10 = refract_func(&r_in->direction,&local_98,fVar7);
  auVar6 = local_38;
  if (((undefined1  [16])RVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    (__return_storage_ptr__->scattered).origin.x = (float)local_38._0_4_;
    (__return_storage_ptr__->scattered).origin.y = (float)local_38._4_4_;
    (__return_storage_ptr__->scattered).origin.z = fVar3;
    local_38 = auVar6;
    dVar1 = sqrt((double)(ulong)(uint)(fVar8 * fVar8 +
                                      (float)local_88._0_4_ * (float)local_88._0_4_ +
                                      (float)local_68._0_4_ * (float)local_68._0_4_));
    fVar2 = SUB84(dVar1,0);
    (__return_storage_ptr__->scattered).direction.x = (float)local_88._0_4_ / fVar2;
    (__return_storage_ptr__->scattered).direction.y = (float)local_68._0_4_ / fVar2;
    (__return_storage_ptr__->scattered).direction.z = fVar8 / fVar2;
    __return_storage_ptr__->index = 0.0;
    (__return_storage_ptr__->refracted).origin.x = 0.0;
    (__return_storage_ptr__->refracted).origin.y = 0.0;
    (__return_storage_ptr__->refracted).origin.z = 0.0;
    dVar1 = sqrt(5.26354424712089e-315);
    fVar2 = 1.0 / SUB84(dVar1,0);
    local_88._0_4_ = 0.0 / SUB84(dVar1,0);
    fVar8 = (float)local_88._0_4_;
  }
  else {
    local_48 = ZEXT416((uint)RVar10.refracted.x);
    fStack_50 = (float)extraout_XMM0_Dc;
    local_58 = (undefined1  [8])RVar10.refracted._4_8_;
    fStack_4c = (float)extraout_XMM0_Dd;
    fVar2 = schlick(local_a4,*(float *)&(this->super_Material).field_0x14);
    auVar6 = local_38;
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    (__return_storage_ptr__->scattered).origin.x = (float)local_38._0_4_;
    (__return_storage_ptr__->scattered).origin.y = (float)local_38._4_4_;
    (__return_storage_ptr__->scattered).origin.z = fVar3;
    local_38 = auVar6;
    dVar1 = sqrt((double)(ulong)(uint)(fVar8 * fVar8 +
                                      (float)local_88._0_4_ * (float)local_88._0_4_ +
                                      (float)local_68._0_4_ * (float)local_68._0_4_));
    auVar6 = local_38;
    fVar9 = SUB84(dVar1,0);
    (__return_storage_ptr__->scattered).direction.x = (float)local_88._0_4_ / fVar9;
    (__return_storage_ptr__->scattered).direction.y = (float)local_68._0_4_ / fVar9;
    (__return_storage_ptr__->scattered).direction.z = fVar8 / fVar9;
    __return_storage_ptr__->index = fVar2;
    (__return_storage_ptr__->refracted).origin.x = (float)local_38._0_4_;
    (__return_storage_ptr__->refracted).origin.y = (float)local_38._4_4_;
    (__return_storage_ptr__->refracted).origin.z = fVar3;
    local_88._4_4_ = local_58._4_4_;
    local_88._0_4_ = local_58._4_4_;
    fStack_80 = (float)local_58._4_4_;
    fStack_7c = (float)local_58._4_4_;
    local_38 = auVar6;
    dVar1 = sqrt((double)CONCAT44(local_58._4_4_,
                                  (float)local_58._4_4_ * (float)local_58._4_4_ +
                                  (float)local_48._0_4_ * (float)local_48._0_4_ +
                                  (float)local_58._0_4_ * (float)local_58._0_4_));
    fVar8 = SUB84(dVar1,0);
    fVar2 = (float)local_48._0_4_ / fVar8;
    local_88._0_4_ = (float)local_88._0_4_ / fVar8;
    fVar8 = (float)local_58._0_4_ / fVar8;
  }
  (__return_storage_ptr__->refracted).direction.x = fVar2;
  (__return_storage_ptr__->refracted).direction.y = fVar8;
  (__return_storage_ptr__->refracted).direction.z = (float)local_88._0_4_;
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 outward_normal;
		Vec3 reflected = reflect (r_in.direction, normal);
		float ni_over_nt = 0;
		float reflect_prob = 0;
		float cosine = 0;

		if (dot (r_in.direction, normal) > 0)
		{
			outward_normal = -normal;
			ni_over_nt = ref_idx;
			cosine = ref_idx * dot (r_in.direction, normal) / r_in.direction.length ();
		}
		else
		{
			outward_normal = normal;
			ni_over_nt = 1.0 / ref_idx;
		}
		RefractDataOut refracted = refract_func (r_in.direction, outward_normal, ni_over_nt);
		if (refracted.is_refracted)
		{
			reflect_prob = schlick (cosine, ref_idx);
			return { true,
				Vec3 (1.0, 1.0, 1.0),
				Ray (point, reflected),
				reflect_prob,
				Ray (point, refracted.refracted) };
		}
		else
		{
			return { true, Vec3 (1.0, 1.0, 1.0), Ray (point, reflected), 0.0 };
		}
	}